

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O3

int X509_VERIFY_PARAM_set1_ip_asc(X509_VERIFY_PARAM *param,char *ipasc)

{
  uint uVar1;
  int iVar2;
  uchar ipout [16];
  uint8_t auStack_18 [16];
  
  uVar1 = x509v3_a2i_ipadd(auStack_18,ipasc);
  if (uVar1 != 0) {
    if (((uVar1 == 0x10) || (uVar1 == 4)) &&
       (iVar2 = int_x509_param_set1((char **)&param->ip,&param->iplen,(char *)auStack_18,
                                    (ulong)uVar1), iVar2 != 0)) {
      return 1;
    }
    param->poison = '\x01';
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int X509_VERIFY_PARAM_set1_ip_asc(X509_VERIFY_PARAM *param, const char *ipasc) {
  unsigned char ipout[16];
  size_t iplen;

  iplen = (size_t)x509v3_a2i_ipadd(ipout, ipasc);
  if (iplen == 0) {
    return 0;
  }
  return X509_VERIFY_PARAM_set1_ip(param, ipout, iplen);
}